

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rshapes.c
# Opt level: O1

void DrawRing(Vector2 center,float innerRadius,float outerRadius,float startAngle,float endAngle,
             int segments,Color color)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float radius;
  float local_ac;
  float local_98;
  float fStack_94;
  float local_68;
  float fStack_64;
  float local_58;
  float fStack_54;
  
  if ((startAngle == endAngle) && (!NAN(startAngle) && !NAN(endAngle))) {
    return;
  }
  radius = (float)(~-(uint)(outerRadius < innerRadius) & (uint)outerRadius |
                  (~-(uint)(0.0 < innerRadius) & 0x3dcccccd |
                  -(uint)(0.0 < innerRadius) & (uint)innerRadius) &
                  -(uint)(outerRadius < innerRadius));
  if (innerRadius <= outerRadius) {
    outerRadius = innerRadius;
  }
  local_ac = endAngle;
  if (startAngle <= endAngle) {
    local_ac = startAngle;
    startAngle = endAngle;
  }
  fVar4 = startAngle - local_ac;
  fVar5 = ceilf(fVar4 / 90.0);
  if (segments < (int)fVar5) {
    fVar6 = -0.5 / radius + 1.0;
    fVar6 = fVar6 * fVar6;
    fVar6 = acosf(fVar6 + fVar6 + -1.0);
    fVar6 = ceilf(6.2831855 / fVar6);
    iVar3 = (int)((fVar6 * fVar4) / 360.0);
    segments = (int)fVar5;
    if (0 < iVar3) {
      segments = iVar3;
    }
  }
  if (0.0 < outerRadius) {
    rlSetTexture(texShapes.id);
    uVar2 = texShapesRec._8_8_;
    uVar1 = texShapesRec._0_8_;
    rlBegin(7);
    if (0 < segments) {
      fVar5 = (float)segments;
      local_58 = (float)uVar1;
      fStack_54 = SUB84(uVar1,4);
      local_68 = (float)uVar2;
      fStack_64 = SUB84(uVar2,4);
      fStack_94 = center.y;
      do {
        rlColor4ub(color.r,color.g,color.b,color.a);
        rlTexCoord2f(local_58 / (float)texShapes.width,
                     (fStack_64 + fStack_54) / (float)texShapes.height);
        fVar8 = local_ac * 0.017453292;
        fVar6 = cosf(fVar8);
        local_98 = center.x;
        fVar7 = sinf(fVar8);
        rlVertex2f(fVar6 * radius + local_98,fVar7 * radius + fStack_94);
        rlTexCoord2f(local_58 / (float)texShapes.width,fStack_54 / (float)texShapes.height);
        fVar6 = cosf(fVar8);
        fVar7 = sinf(fVar8);
        rlVertex2f(fVar6 * outerRadius + local_98,fVar7 * outerRadius + fStack_94);
        rlTexCoord2f((local_68 + local_58) / (float)texShapes.width,
                     fStack_54 / (float)texShapes.height);
        local_ac = local_ac + fVar4 / fVar5;
        fVar6 = local_ac * 0.017453292;
        fVar7 = cosf(fVar6);
        fVar8 = sinf(fVar6);
        rlVertex2f(fVar7 * outerRadius + local_98,fVar8 * outerRadius + fStack_94);
        rlTexCoord2f((local_68 + local_58) / (float)texShapes.width,
                     (fStack_64 + fStack_54) / (float)texShapes.height);
        fVar7 = cosf(fVar6);
        fVar6 = sinf(fVar6);
        rlVertex2f(fVar7 * radius + local_98,fVar6 * radius + fStack_94);
        segments = segments + -1;
      } while (segments != 0);
    }
    rlEnd();
    rlSetTexture(0);
    return;
  }
  DrawCircleSector(center,radius,local_ac,startAngle,segments,color);
  return;
}

Assistant:

void DrawRing(Vector2 center, float innerRadius, float outerRadius, float startAngle, float endAngle, int segments, Color color)
{
    if (startAngle == endAngle) return;

    // Function expects (outerRadius > innerRadius)
    if (outerRadius < innerRadius)
    {
        float tmp = outerRadius;
        outerRadius = innerRadius;
        innerRadius = tmp;

        if (outerRadius <= 0.0f) outerRadius = 0.1f;
    }

    // Function expects (endAngle > startAngle)
    if (endAngle < startAngle)
    {
        // Swap values
        float tmp = startAngle;
        startAngle = endAngle;
        endAngle = tmp;
    }

    int minSegments = (int)ceilf((endAngle - startAngle)/90);

    if (segments < minSegments)
    {
        // Calculate the maximum angle between segments based on the error rate (usually 0.5f)
        float th = acosf(2*powf(1 - SMOOTH_CIRCLE_ERROR_RATE/outerRadius, 2) - 1);
        segments = (int)((endAngle - startAngle)*ceilf(2*PI/th)/360);

        if (segments <= 0) segments = minSegments;
    }

    // Not a ring
    if (innerRadius <= 0.0f)
    {
        DrawCircleSector(center, outerRadius, startAngle, endAngle, segments, color);
        return;
    }

    float stepLength = (endAngle - startAngle)/(float)segments;
    float angle = startAngle;

#if defined(SUPPORT_QUADS_DRAW_MODE)
    rlSetTexture(GetShapesTexture().id);
    Rectangle shapeRect = GetShapesTextureRectangle();

    rlBegin(RL_QUADS);
        for (int i = 0; i < segments; i++)
        {
            rlColor4ub(color.r, color.g, color.b, color.a);

            rlTexCoord2f(shapeRect.x/texShapes.width, (shapeRect.y + shapeRect.height)/texShapes.height);
            rlVertex2f(center.x + cosf(DEG2RAD*angle)*outerRadius, center.y + sinf(DEG2RAD*angle)*outerRadius);

            rlTexCoord2f(shapeRect.x/texShapes.width, shapeRect.y/texShapes.height);
            rlVertex2f(center.x + cosf(DEG2RAD*angle)*innerRadius, center.y + sinf(DEG2RAD*angle)*innerRadius);

            rlTexCoord2f((shapeRect.x + shapeRect.width)/texShapes.width, shapeRect.y/texShapes.height);
            rlVertex2f(center.x + cosf(DEG2RAD*(angle + stepLength))*innerRadius, center.y + sinf(DEG2RAD*(angle + stepLength))*innerRadius);

            rlTexCoord2f((shapeRect.x + shapeRect.width)/texShapes.width, (shapeRect.y + shapeRect.height)/texShapes.height);
            rlVertex2f(center.x + cosf(DEG2RAD*(angle + stepLength))*outerRadius, center.y + sinf(DEG2RAD*(angle + stepLength))*outerRadius);

            angle += stepLength;
        }
    rlEnd();

    rlSetTexture(0);
#else
    rlBegin(RL_TRIANGLES);
        for (int i = 0; i < segments; i++)
        {
            rlColor4ub(color.r, color.g, color.b, color.a);

            rlVertex2f(center.x + cosf(DEG2RAD*angle)*innerRadius, center.y + sinf(DEG2RAD*angle)*innerRadius);
            rlVertex2f(center.x + cosf(DEG2RAD*(angle + stepLength))*innerRadius, center.y + sinf(DEG2RAD*(angle + stepLength))*innerRadius);
            rlVertex2f(center.x + cosf(DEG2RAD*angle)*outerRadius, center.y + sinf(DEG2RAD*angle)*outerRadius);

            rlVertex2f(center.x + cosf(DEG2RAD*(angle + stepLength))*innerRadius, center.y + sinf(DEG2RAD*(angle + stepLength))*innerRadius);
            rlVertex2f(center.x + cosf(DEG2RAD*(angle + stepLength))*outerRadius, center.y + sinf(DEG2RAD*(angle + stepLength))*outerRadius);
            rlVertex2f(center.x + cosf(DEG2RAD*angle)*outerRadius, center.y + sinf(DEG2RAD*angle)*outerRadius);

            angle += stepLength;
        }
    rlEnd();
#endif
}